

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O3

void __thiscall cmFindPackageCommand::PushFindPackageRootPathStack(cmFindPackageCommand *this)

{
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_00;
  cmMakefile *pcVar1;
  pointer pcVar2;
  undefined8 uVar3;
  PolicyStatus PVar4;
  int iVar5;
  cmValue value;
  cmValue rootDEF;
  PolicyID id;
  PolicyID id_00;
  _Alloc_hider _Var6;
  _Elt_pointer pvVar7;
  EmptyElements in_R9D;
  long lVar8;
  ulong uVar9;
  string_view value_00;
  string_view value_01;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> rootENV
  ;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  p;
  string rootVar;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> rootEnv
  ;
  string rootVAR;
  undefined1 local_e8 [32];
  bool local_c8;
  undefined1 local_c0 [32];
  bool local_a0;
  string local_98;
  undefined1 local_78 [32];
  bool local_58;
  string local_50;
  
  std::
  deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::emplace_back<>(&((this->super_cmFindCommon).Makefile)->FindPackageRootPathStack);
  pcVar1 = (this->super_cmFindCommon).Makefile;
  pvVar7 = (pcVar1->FindPackageRootPathStack).
           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pvVar7 == (pcVar1->FindPackageRootPathStack).
                super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pvVar7 = (pcVar1->FindPackageRootPathStack).
             super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  pcVar2 = (this->Name)._M_dataplus._M_p;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (this->Name)._M_string_length);
  std::__cxx11::string::append((char *)&local_98);
  value = cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,&local_98);
  if (value.Value == (string *)0x0) {
    value.Value = (string *)0x0;
  }
  else if ((value.Value)->_M_string_length == 0) {
    value.Value = (string *)0x0;
  }
  cmSystemTools::GetEnvVar
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_78,&local_98);
  if (((local_58 == true) && (local_78._8_8_ == 0)) &&
     (local_58 = false, (undefined1 *)local_78._0_8_ != local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  PVar4 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0074,false);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    pcVar1 = (this->super_cmFindCommon).Makefile;
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_e8,(cmPolicies *)0x4a,id);
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_e8);
    if ((undefined1 *)local_e8._0_8_ == local_e8 + 0x10) goto LAB_003d3f68;
  }
  else {
    if (PVar4 == OLD) goto LAB_003d3f68;
    if (PVar4 == WARN) {
      cmMakefile::MaybeWarnCMP0074
                ((this->super_cmFindCommon).Makefile,&local_98,value,
                 (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_78);
      goto LAB_003d3f68;
    }
    cmsys::SystemTools::UpperCase(&local_50,&local_98);
    local_c8 = false;
    if ((local_50._M_string_length == local_98._M_string_length) &&
       ((local_50._M_string_length == 0 ||
        (iVar5 = bcmp(local_50._M_dataplus._M_p,local_98._M_dataplus._M_p,local_50._M_string_length)
        , iVar5 == 0)))) {
      rootDEF.Value = (string *)0x0;
    }
    else {
      rootDEF = cmMakefile::GetDefinition((this->super_cmFindCommon).Makefile,&local_50);
      if ((rootDEF.Value == (string *)0x0) ||
         (((rootDEF.Value)->_M_string_length == 0 ||
          (local_c0._0_8_ = rootDEF, iVar5 = cmValue::Compare((cmValue *)local_c0,value), iVar5 == 0
          )))) {
        rootDEF.Value = (string *)0x0;
      }
      cmSystemTools::GetEnvVar
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c0,&local_50);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_move_assign((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_e8,
                       (_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_c0);
      if ((local_a0 == true) && (local_a0 = false, (undefined1 *)local_c0._0_8_ != local_c0 + 0x10))
      {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
      uVar3 = local_e8._0_8_;
      if ((local_c8 == true) &&
         (((local_e8._8_8_ == 0 ||
           (((local_58 == true && (local_e8._8_8_ == local_78._8_8_)) &&
            (iVar5 = bcmp((void *)local_e8._0_8_,(void *)local_78._0_8_,local_e8._8_8_), iVar5 == 0)
            ))) && (local_c8 = false, (undefined1 *)uVar3 != local_e8 + 0x10)))) {
        operator_delete((void *)uVar3,local_e8._16_8_ + 1);
      }
    }
    PVar4 = cmMakefile::GetPolicyStatus((this->super_cmFindCommon).Makefile,CMP0144,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      pcVar1 = (this->super_cmFindCommon).Makefile;
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_c0,(cmPolicies *)0x90,id_00);
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_c0);
      if ((undefined1 *)local_c0._0_8_ != local_c0 + 0x10) {
        operator_delete((void *)local_c0._0_8_,local_c0._16_8_ + 1);
      }
    }
    else {
      if (PVar4 == OLD) {
LAB_003d3dd2:
        if ((local_c8 == true) &&
           (local_c8 = false, (undefined1 *)local_e8._0_8_ != local_e8 + 0x10)) {
          operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
        }
        rootDEF.Value = (string *)0x0;
      }
      else if (PVar4 == WARN) {
        cmMakefile::MaybeWarnCMP0144
                  ((this->super_cmFindCommon).Makefile,&local_50,rootDEF,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_e8);
        goto LAB_003d3dd2;
      }
      this_00 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)(pvVar7 + -1);
      if (value.Value != (string *)0x0) {
        value_00._M_str = (char *)0x0;
        value_00._M_len = (size_t)((value.Value)->_M_dataplus)._M_p;
        cmList::insert((cmList *)this_00,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pvVar7[-1].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (value.Value)->_M_string_length,value_00,in_R9D);
      }
      if (rootDEF.Value != (string *)0x0) {
        value_01._M_str = (char *)0x0;
        value_01._M_len = (size_t)((rootDEF.Value)->_M_dataplus)._M_p;
        cmList::insert((cmList *)this_00,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)pvVar7[-1].
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (rootDEF.Value)->_M_string_length,value_01,in_R9D);
      }
      if (local_58 == true) {
        cmSystemTools::SplitEnvPath
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0,(string *)local_78);
        lVar8 = (long)(local_c0._8_8_ - local_c0._0_8_) >> 5;
        if (0 < lVar8) {
          uVar9 = lVar8 + 1;
          _Var6._M_p = (pointer)local_c0._0_8_;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               _Var6._M_p);
            _Var6._M_p = _Var6._M_p + 0x20;
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
      }
      if (local_c8 == true) {
        cmSystemTools::SplitEnvPath
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0,(string *)local_e8);
        lVar8 = (long)(local_c0._8_8_ - local_c0._0_8_) >> 5;
        if (0 < lVar8) {
          uVar9 = lVar8 + 1;
          _Var6._M_p = (pointer)local_c0._0_8_;
          do {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               _Var6._M_p);
            _Var6._M_p = _Var6._M_p + 0x20;
            uVar9 = uVar9 - 1;
          } while (1 < uVar9);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_c0);
      }
    }
    if ((local_c8 == true) && (local_c8 = false, (undefined1 *)local_e8._0_8_ != local_e8 + 0x10)) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    local_e8._16_8_ = local_50.field_2._M_allocated_capacity;
    local_e8._0_8_ = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_003d3f68;
  }
  operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
LAB_003d3f68:
  if ((local_58 == true) && (local_58 = false, (undefined1 *)local_78._0_8_ != local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFindPackageCommand::PushFindPackageRootPathStack()
{
  // Allocate a PACKAGE_ROOT_PATH for the current find_package call.
  this->Makefile->FindPackageRootPathStack.emplace_back();
  std::vector<std::string>& rootPaths =
    this->Makefile->FindPackageRootPathStack.back();

  // Add root paths from <PackageName>_ROOT CMake and environment variables,
  // subject to CMP0074.
  std::string const rootVar = this->Name + "_ROOT";
  cmValue rootDef = this->Makefile->GetDefinition(rootVar);
  if (rootDef && rootDef.IsEmpty()) {
    rootDef = nullptr;
  }
  cm::optional<std::string> rootEnv = cmSystemTools::GetEnvVar(rootVar);
  if (rootEnv && rootEnv->empty()) {
    rootEnv = cm::nullopt;
  }
  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0074)) {
    case cmPolicies::WARN:
      this->Makefile->MaybeWarnCMP0074(rootVar, rootDef, rootEnv);
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to ignore the <PackageName>_ROOT variables.
      return;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0074));
      return;
    case cmPolicies::NEW: {
      // NEW behavior is to honor the <PackageName>_ROOT variables.
    } break;
  }

  // Add root paths from <PACKAGENAME>_ROOT CMake and environment variables,
  // if they are different than <PackageName>_ROOT, and subject to CMP0144.
  std::string const rootVAR = cmSystemTools::UpperCase(rootVar);
  cmValue rootDEF;
  cm::optional<std::string> rootENV;
  if (rootVAR != rootVar) {
    rootDEF = this->Makefile->GetDefinition(rootVAR);
    if (rootDEF && (rootDEF.IsEmpty() || rootDEF == rootDef)) {
      rootDEF = nullptr;
    }
    rootENV = cmSystemTools::GetEnvVar(rootVAR);
    if (rootENV && (rootENV->empty() || rootENV == rootEnv)) {
      rootENV = cm::nullopt;
    }
  }

  switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0144)) {
    case cmPolicies::WARN:
      this->Makefile->MaybeWarnCMP0144(rootVAR, rootDEF, rootENV);
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      // OLD behavior is to ignore the <PACKAGENAME>_ROOT variables.
      rootDEF = nullptr;
      rootENV = cm::nullopt;
      break;
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      this->Makefile->IssueMessage(
        MessageType::FATAL_ERROR,
        cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0144));
      return;
    case cmPolicies::NEW: {
      // NEW behavior is to honor the <PACKAGENAME>_ROOT variables.
    } break;
  }

  if (rootDef) {
    cmExpandList(*rootDef, rootPaths);
  }
  if (rootDEF) {
    cmExpandList(*rootDEF, rootPaths);
  }
  if (rootEnv) {
    std::vector<std::string> p = cmSystemTools::SplitEnvPath(*rootEnv);
    std::move(p.begin(), p.end(), std::back_inserter(rootPaths));
  }
  if (rootENV) {
    std::vector<std::string> p = cmSystemTools::SplitEnvPath(*rootENV);
    std::move(p.begin(), p.end(), std::back_inserter(rootPaths));
  }
}